

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O0

void __thiscall MathOp::Mod2m::forward(Mod2m *this)

{
  bool bVar1;
  Mat *a;
  Mat *this_00;
  Op *in_RDI;
  int i;
  int local_19c;
  Mat *in_stack_fffffffffffffe68;
  Mat *in_stack_fffffffffffffe70;
  ll in_stack_fffffffffffffe80;
  Mat *in_stack_fffffffffffffe88;
  Mat *in_stack_fffffffffffffe90;
  Mat *in_stack_fffffffffffffe98;
  ll128 *in_stack_fffffffffffffed0;
  Mat *in_stack_fffffffffffffed8;
  Mat *in_stack_fffffffffffffee0;
  Mat *in_stack_fffffffffffffee8;
  
  Op::reinit(in_RDI);
  switch(in_RDI->forwardRound) {
  case 1:
    break;
  case 2:
    Mat::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    Mat::operator*(in_stack_fffffffffffffe98,(ll128 *)in_stack_fffffffffffffe90);
    Mat::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    Mat::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    Mat::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    Mat::~Mat((Mat *)0x12bd5a);
    Mat::~Mat((Mat *)0x12bd67);
    Mat::~Mat((Mat *)0x12bd74);
    Mat::~Mat((Mat *)0x12bd81);
    break;
  case 3:
    (**(code **)**(undefined8 **)&in_RDI[3].forwardRound)();
    bVar1 = Op::forwardHasNext(*(Op **)&in_RDI[3].forwardRound);
    if (bVar1) {
      in_RDI->forwardRound = in_RDI->forwardRound + -1;
    }
    break;
  case 4:
    Mat::mod(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    Mat::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    Mat::~Mat((Mat *)0x12be90);
    break;
  case 5:
    (**(code **)**(undefined8 **)&in_RDI[3].backRound)();
    bVar1 = Op::forwardHasNext(*(Op **)&in_RDI[3].backRound);
    if (bVar1) {
      in_RDI->forwardRound = in_RDI->forwardRound + -1;
    }
    break;
  case 6:
    Mat::operator-(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    a = (Mat *)(1L << (in_RDI[2].field_0x1c & 0x3f));
    this_00 = (Mat *)((long)a >> 0x3f);
    Mat::operator*(in_stack_fffffffffffffe98,(ll128 *)in_stack_fffffffffffffe90);
    Mat::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    Mat::operator=(this_00,a);
    Mat::~Mat((Mat *)0x12bf7e);
    Mat::~Mat((Mat *)0x12bf88);
    Mat::~Mat((Mat *)0x12bf92);
    Mat::clear(in_stack_fffffffffffffe90);
    Mat::clear(in_stack_fffffffffffffe90);
    for (local_19c = 0; local_19c < *(int *)&in_RDI[2].field_0x1c; local_19c = local_19c + 1) {
      Mat::clear(in_stack_fffffffffffffe90);
    }
    Mat::clear(in_stack_fffffffffffffe90);
    Mat::clear(in_stack_fffffffffffffe90);
  }
  return;
}

Assistant:

void MathOp::Mod2m::forward() {
    reinit();
    switch (forwardRound) {
        case 1:
//            r_nd->clear();
//            r_st->clear();
//            for (int i = 0; i < m; i++) {
//                r_B[i].clear();
//            }
//            u->clear();
//            b->clear();
            // pRandM->forward();
            // if (pRandM->forwardHasNext()) {
            //     forwardRound--;
            // }
            break;
        case 2:
            // todo: m+r > q 的问题
            *b = *a + (1ll << (BIT_P_LEN - 1)) + (*r_nd) * (1ll << m) + (*r_st);
            break;
        case 3:
            pRevealD->forward();
            if (pRevealD->forwardHasNext()) {
                forwardRound--;
            }
            break;
        case 4:
//            cout << "Test Mod2m\n";
//            b->print();
            *b = b->mod(1ll << m);
//            b->print();
            break;
        case 5:
            pBitLT->forward();
            if (pBitLT->forwardHasNext()) {
                forwardRound--;
            }
            break;
        case 6:
            *res = *b - (*r_st) + (*u) * (1ll << m);
            r_nd->clear();
            r_st->clear();
            for (int i = 0; i < m; i++) {
                r_B[i].clear();
            }
            u->clear();
            b->clear();
            break;
    }
}